

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

Client __thiscall
capnp::_::anon_unknown_0::TestRestorer::restore(TestRestorer *this,Reader objectId)

{
  Server *pSVar1;
  long *plVar2;
  ClientHook *pCVar3;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  long in_RSI;
  Own<capnp::ClientHook> OVar4;
  Client CVar5;
  StringPtr reason;
  Own<capnp::Capability::Server> local_38;
  Disposer *local_20;
  long *local_18;
  
  if (objectId._reader.dataSize < 0x10) {
switchD_0030c0e6_caseD_0:
    kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_20,*(int **)(in_RSI + 8));
    local_38.disposer = local_20;
    local_38.ptr = (Server *)((long)local_18 + 0x10);
    if (local_18 == (long *)0x0) {
      local_38.ptr = (Server *)0x0;
    }
    local_18 = (long *)0x0;
    OVar4 = Capability::Client::makeLocalClient((Client *)this,&local_38);
    pSVar1 = local_38.ptr;
    pCVar3 = OVar4.ptr;
    if (local_38.ptr != (Server *)0x0) {
      local_38.ptr = (Server *)0x0;
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
      pCVar3 = extraout_RDX;
    }
  }
  else {
    switch(*objectId._reader.data) {
    case 0:
      goto switchD_0030c0e6_caseD_0;
    case 1:
      reason.content.size_ = (size_t)"No TestExtends implemented.";
      reason.content.ptr = (char *)&local_38;
      OVar4 = newBrokenCap(reason);
      pCVar3 = OVar4.ptr;
      (this->super_SturdyRefRestorer<capnproto_test::capnp::test::TestSturdyRefObjectId>).
      super_SturdyRefRestorerBase._vptr_SturdyRefRestorerBase = (_func_int **)local_38.disposer;
      *(Server **)&this->callCount = local_38.ptr;
      goto LAB_0030c0b7;
    case 2:
      kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&local_20,*(int **)(in_RSI + 8));
      local_38.disposer = local_20;
      local_38.ptr = (Server *)((long)local_18 + 0x10);
      if (local_18 == (long *)0x0) {
        local_38.ptr = (Server *)0x0;
      }
      local_18 = (long *)0x0;
      OVar4 = Capability::Client::makeLocalClient((Client *)this,&local_38);
      pSVar1 = local_38.ptr;
      pCVar3 = OVar4.ptr;
      if (local_38.ptr != (Server *)0x0) {
        local_38.ptr = (Server *)0x0;
        (**(local_38.disposer)->_vptr_Disposer)
                  (local_38.disposer,
                   (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
        pCVar3 = extraout_RDX_02;
      }
      break;
    case 3:
      kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&local_20,*(int **)(in_RSI + 8));
      local_38.disposer = local_20;
      local_38.ptr = (Server *)((long)local_18 + 0x10);
      if (local_18 == (long *)0x0) {
        local_38.ptr = (Server *)0x0;
      }
      local_18 = (long *)0x0;
      OVar4 = Capability::Client::makeLocalClient((Client *)this,&local_38);
      pSVar1 = local_38.ptr;
      pCVar3 = OVar4.ptr;
      if (local_38.ptr != (Server *)0x0) {
        local_38.ptr = (Server *)0x0;
        (**(local_38.disposer)->_vptr_Disposer)
                  (local_38.disposer,
                   (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
        pCVar3 = extraout_RDX_03;
      }
      break;
    case 4:
      kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&local_20,*(int **)(in_RSI + 8));
      local_38.disposer = local_20;
      local_38.ptr = (Server *)((long)local_18 + 0x10);
      if (local_18 == (long *)0x0) {
        local_38.ptr = (Server *)0x0;
      }
      local_18 = (long *)0x0;
      OVar4 = Capability::Client::makeLocalClient((Client *)this,&local_38);
      pSVar1 = local_38.ptr;
      pCVar3 = OVar4.ptr;
      if (local_38.ptr != (Server *)0x0) {
        local_38.ptr = (Server *)0x0;
        (**(local_38.disposer)->_vptr_Disposer)
                  (local_38.disposer,
                   (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
        pCVar3 = extraout_RDX_01;
      }
      break;
    case 5:
      kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
                ((kj *)&local_20,*(int **)(in_RSI + 8),*(int **)(in_RSI + 0x10));
      local_38.disposer = local_20;
      local_38.ptr = (Server *)((long)local_18 + 0x30);
      if (local_18 == (long *)0x0) {
        local_38.ptr = (Server *)0x0;
      }
      local_18 = (long *)0x0;
      OVar4 = Capability::Client::makeLocalClient((Client *)this,&local_38);
      pSVar1 = local_38.ptr;
      pCVar3 = OVar4.ptr;
      if (local_38.ptr != (Server *)0x0) {
        local_38.ptr = (Server *)0x0;
        (**(local_38.disposer)->_vptr_Disposer)
                  (local_38.disposer,
                   (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
        pCVar3 = extraout_RDX_04;
      }
      break;
    default:
      kj::_::unreachable();
    }
  }
  plVar2 = local_18;
  if (local_18 != (long *)0x0) {
    local_18 = (long *)0x0;
    (**local_20->_vptr_Disposer)(local_20,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    pCVar3 = extraout_RDX_00;
  }
LAB_0030c0b7:
  CVar5.hook.ptr = pCVar3;
  CVar5.hook.disposer = (Disposer *)this;
  return (Client)CVar5.hook;
}

Assistant:

Capability::Client restore(test::TestSturdyRefObjectId::Reader objectId) override {
    switch (objectId.getTag()) {
      case test::TestSturdyRefObjectId::Tag::TEST_INTERFACE:
        return kj::heap<TestInterfaceImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_EXTENDS:
        return Capability::Client(newBrokenCap("No TestExtends implemented."));
      case test::TestSturdyRefObjectId::Tag::TEST_PIPELINE:
        return kj::heap<TestPipelineImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLEE:
        return kj::heap<TestTailCalleeImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLER:
        return kj::heap<TestTailCallerImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF:
        return kj::heap<TestMoreStuffImpl>(callCount, handleCount);
    }
    KJ_UNREACHABLE;
  }